

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Cnf_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  size_t __size;
  int Lit;
  int nVars;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_40 = sat_solver_nvars(p);
  iVar3 = vVars->nSize;
  if ((long)iVar3 < 2) {
    __assert_fail("nSizeOld >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x73,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  lVar6 = 0;
  do {
    if ((vVars->pArray[lVar6] < 0) || (local_40 <= vVars->pArray[lVar6])) {
      __assert_fail("iVar >= 0 && iVar < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x76,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
    lVar6 = lVar6 + 1;
  } while (iVar3 != lVar6);
  iVar2 = 1;
  do {
    iVar5 = iVar2;
    iVar2 = iVar5 * 2;
  } while (iVar5 < iVar3);
  local_3c = fStrict;
  sat_solver_setnvars(p,local_40 + ((uint)(iVar5 * iVar5) >> 1) + 1);
  iVar2 = local_40;
  if (iVar5 != iVar3) {
    if (vVars->nSize < iVar5) {
      iVar1 = vVars->nCap;
      lVar6 = (long)iVar1 * 2;
      if ((int)lVar6 < iVar5) {
        if (iVar1 < iVar5) {
          if (vVars->pArray == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar5 << 2);
          }
          else {
            piVar4 = (int *)realloc(vVars->pArray,(long)iVar5 << 2);
          }
          vVars->pArray = piVar4;
          iVar1 = iVar5;
joined_r0x0053098b:
          if (piVar4 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vVars->nCap = iVar1;
        }
      }
      else if (iVar1 < (int)lVar6 && iVar1 < iVar5) {
        __size = (long)iVar1 << 3;
        local_38 = lVar6;
        if (vVars->pArray == (int *)0x0) {
          piVar4 = (int *)malloc(__size);
        }
        else {
          piVar4 = (int *)realloc(vVars->pArray,__size);
        }
        vVars->pArray = piVar4;
        iVar1 = (int)local_38;
        goto joined_r0x0053098b;
      }
      lVar6 = (long)vVars->nSize;
      if (vVars->nSize < iVar5) {
        piVar4 = vVars->pArray;
        do {
          piVar4[lVar6] = iVar2;
          lVar6 = lVar6 + 1;
        } while (iVar5 != lVar6);
      }
      vVars->nSize = iVar5;
    }
    iVar2 = local_40 + 1;
    if (local_40 < 0) goto LAB_00530acd;
    local_44 = local_40 * 2 + 1;
    local_40 = local_40 + 1;
    iVar2 = sat_solver_addclause(p,&local_44,&local_40);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x82,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  Cnf_AddCardinConstrRange(p,vVars->pArray,0,iVar5 + -1,&local_40);
  if ((K < 1) || (iVar3 <= K)) {
    __assert_fail("K > 0 && K < nSizeOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x88,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (vVars->nSize <= K) {
LAB_00530aec:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = local_40;
  if (vVars->pArray[(uint)K] < 0) {
LAB_00530acd:
    local_40 = iVar2;
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  local_44 = vVars->pArray[(uint)K] * 2 + 1;
  iVar3 = sat_solver_addclause(p,&local_44,&local_40);
  if (iVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x8b,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (local_3c != 0) {
    if (vVars->nSize < K) goto LAB_00530aec;
    iVar2 = local_40;
    if (vVars->pArray[(ulong)(uint)K - 1] < 0) goto LAB_00530acd;
    local_44 = vVars->pArray[(ulong)(uint)K - 1] * 2;
    iVar3 = sat_solver_addclause(p,&local_44,&local_40);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x90,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  if (vVars->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vVars->nSize = 0;
  return;
}

Assistant:

void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int nVars = sat_solver_nvars(p);
    int nSizeOld = Vec_IntSize(vVars);
    int i, iVar, nSize, Lit, nVarsOld;
    assert( nSizeOld >= 2 );
    // check that vars are ok
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    // make the size a degree of two
    for ( nSize = 1; nSize < nSizeOld; nSize *= 2 );
    // extend
    sat_solver_setnvars( p, nVars + 1 + nSize * nSize / 2 );
    if ( nSize != nSizeOld )
    {
        // fill in with const0
        Vec_IntFillExtra( vVars, nSize, nVars );
        // add const0 variable
        Lit = Abc_Var2Lit( nVars++, 1 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // construct recursively
    nVarsOld = nVars;
    Cnf_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nSize - 1, &nVars );
    // add final constraint
    assert( K > 0 && K < nSizeOld );
    Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K-1), 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // return to the old size
    Vec_IntShrink( vVars, 0 ); // make it unusable
    //printf( "The %d input sorting network contains %d sorters.\n", nSize, (nVars - nVarsOld)/2 );
}